

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O3

MPP_RET mpp_dec_stop(MppDec ctx)

{
  MppThread *pMVar1;
  
  if (((byte)mpp_dec_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec","%p in\n","mpp_dec_stop",ctx);
  }
  if (*(MppThread **)((long)ctx + 0x20) != (MppThread *)0x0) {
    MppThread::stop(*(MppThread **)((long)ctx + 0x20));
  }
  if (*(MppThread **)((long)ctx + 0x28) != (MppThread *)0x0) {
    MppThread::stop(*(MppThread **)((long)ctx + 0x28));
  }
  pMVar1 = *(MppThread **)((long)ctx + 0x20);
  if (pMVar1 != (MppThread *)0x0) {
    MppThread::~MppThread(pMVar1);
    operator_delete(pMVar1,0x198);
    *(undefined8 *)((long)ctx + 0x20) = 0;
  }
  pMVar1 = *(MppThread **)((long)ctx + 0x28);
  if (pMVar1 != (MppThread *)0x0) {
    MppThread::~MppThread(pMVar1);
    operator_delete(pMVar1,0x198);
    *(undefined8 *)((long)ctx + 0x28) = 0;
  }
  if (((byte)mpp_dec_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec","%p out\n","mpp_dec_stop",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_dec_stop(MppDec ctx)
{
    MPP_RET ret = MPP_OK;
    MppDecImpl *dec = (MppDecImpl *)ctx;

    dec_dbg_func("%p in\n", dec);

    if (dec->thread_parser)
        dec->thread_parser->stop();

    if (dec->thread_hal)
        dec->thread_hal->stop();

    if (dec->thread_parser) {
        delete dec->thread_parser;
        dec->thread_parser = NULL;
    }

    if (dec->thread_hal) {
        delete dec->thread_hal;
        dec->thread_hal = NULL;
    }

    dec_dbg_func("%p out\n", dec);
    return ret;
}